

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord3d> *value)

{
  bool bVar1;
  undefined1 local_40 [8];
  texcoord3d v;
  optional<tinyusdz::value::texcoord3d> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(texcoord3d *)local_40);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::operator=
                (value,(texcoord3d *)local_40);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord3d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord3d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}